

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctcp.c
# Opt level: O0

void nn_ctcp_start_connecting(nn_ctcp *self,sockaddr_storage *ss,size_t sslen)

{
  uint16_t __hostshort;
  nn_usock *__s;
  size_t sVar1;
  char *pcVar2;
  undefined8 in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t sz;
  int val;
  size_t ipv4onlylen;
  int ipv4only;
  uint16_t port;
  char *semicolon;
  char *colon;
  char *end;
  char *addr;
  size_t locallen;
  sockaddr_storage local;
  size_t remotelen;
  sockaddr_storage remote;
  int rc;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  nn_ep *in_stack_fffffffffffffe80;
  FILE *__stream;
  nn_usock *self_00;
  sockaddr_storage *in_stack_fffffffffffffe90;
  long lVar3;
  nn_usock *pnVar4;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  nn_ep *self_01;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 local_128 [128];
  undefined8 local_a8;
  short local_a0;
  uint16_t local_9e;
  int local_1c;
  undefined8 local_18;
  void *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  __s = (nn_usock *)nn_ep_getaddr(*(nn_ep **)(in_RDI + 0x60));
  memset(&local_a0,0,0x80);
  pnVar4 = __s;
  sVar1 = strlen((char *)__s);
  self_00 = pnVar4;
  pcVar2 = strrchr((char *)__s,0x3a);
  local_1c = nn_port_resolve(pcVar2 + 1,(size_t)((long)pnVar4 + (sVar1 - (long)pcVar2) + -1));
  if (local_1c < 1) {
    nn_backtrace_print();
    __stream = _stderr;
    pcVar2 = nn_err_strerror(in_stack_fffffffffffffe7c);
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-local_1c,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
            ,0x225);
    fflush(_stderr);
    nn_err_abort();
  }
  __hostshort = (uint16_t)local_1c;
  self_01 = (nn_ep *)0x4;
  nn_ep_getopt((nn_ep *)0x4,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe90,(size_t *)self_00);
  if (self_01 != (nn_ep *)0x4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ipv4onlylen == sizeof (ipv4only)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
            ,0x22c);
    fflush(_stderr);
    nn_err_abort();
  }
  pcVar2 = strchr((char *)__s,0x3b);
  memset(local_128,0,0x80);
  if (pcVar2 == (char *)0x0) {
    local_1c = nn_iface_resolve((char *)CONCAT26(__hostshort,in_stack_fffffffffffffea8),
                                (size_t)self_01,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,
                                (size_t *)self_00);
  }
  else {
    local_1c = nn_iface_resolve((char *)CONCAT26(__hostshort,in_stack_fffffffffffffea8),
                                (size_t)self_01,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe90,
                                (size_t *)self_00);
  }
  if (local_1c < 0) {
    nn_backoff_start((nn_backoff *)in_stack_fffffffffffffe80);
    *(undefined4 *)(local_8 + 0x58) = 8;
  }
  else {
    memcpy(&local_a0,local_10,0x80);
    local_a8 = local_18;
    if (local_a0 == 2) {
      local_9e = htons(__hostshort);
    }
    else {
      if (local_a0 != 10) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
                ,0x244);
        fflush(_stderr);
        nn_err_abort();
      }
      local_9e = htons(__hostshort);
    }
    local_1c = nn_usock_start(self_00,(int)((ulong)in_stack_fffffffffffffe80 >> 0x20),
                              (int)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
    if (local_1c < 0) {
      nn_backoff_start((nn_backoff *)in_stack_fffffffffffffe80);
      *(undefined4 *)(local_8 + 0x58) = 8;
    }
    else {
      lVar3 = 4;
      nn_ep_getopt(self_01,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,(void *)0x4,
                   (size_t *)self_00);
      if (lVar3 != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
                ,0x251);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                          0,4,self_00,(size_t)in_stack_fffffffffffffe80);
      lVar3 = 4;
      nn_ep_getopt(self_01,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,(void *)0x4,
                   (size_t *)self_00);
      if (lVar3 != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
                ,0x256);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                          0,4,self_00,(size_t)in_stack_fffffffffffffe80);
      pnVar4 = (nn_usock *)0x4;
      nn_ep_getopt(self_01,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,(void *)0x4,
                   (size_t *)self_00);
      if (pnVar4 != (nn_usock *)0x4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/ctcp.c"
                ,0x25b);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                          0,4,self_00,(size_t)in_stack_fffffffffffffe80);
      local_1c = nn_usock_bind((nn_usock *)CONCAT26(__hostshort,in_stack_fffffffffffffea8),
                               (sockaddr *)self_01,
                               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      if (local_1c == 0) {
        nn_usock_connect(pnVar4,(sockaddr *)self_00,(size_t)in_stack_fffffffffffffe80);
        *(undefined4 *)(local_8 + 0x58) = 4;
        nn_ep_stat_increment
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      }
      else {
        nn_backoff_start((nn_backoff *)in_stack_fffffffffffffe80);
        *(undefined4 *)(local_8 + 0x58) = 8;
      }
    }
  }
  return;
}

Assistant:

static void nn_ctcp_start_connecting (struct nn_ctcp *self,
    struct sockaddr_storage *ss, size_t sslen)
{
    int rc;
    struct sockaddr_storage remote;
    size_t remotelen;
    struct sockaddr_storage local;
    size_t locallen;
    const char *addr;
    const char *end;
    const char *colon;
    const char *semicolon;
    uint16_t port;
    int ipv4only;
    size_t ipv4onlylen;
    int val;
    size_t sz;

    /*  Create IP address from the address string. */
    addr = nn_ep_getaddr (self->ep);
    memset (&remote, 0, sizeof (remote));

    /*  Parse the port. */
    end = addr + strlen (addr);
    colon = strrchr (addr, ':');
    rc = nn_port_resolve (colon + 1, end - colon - 1);
    errnum_assert (rc > 0, -rc);
    port = rc;

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_IPV4ONLY,
        &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Parse the local address, if any. */
    semicolon = strchr (addr, ';');
    memset (&local, 0, sizeof (local));
    if (semicolon)
        rc = nn_iface_resolve (addr, semicolon - addr, ipv4only,
            &local, &locallen);
    else
        rc = nn_iface_resolve ("*", 1, ipv4only, &local, &locallen);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_CTCP_STATE_WAITING;
        return;
    }

    /*  Combine the remote address and the port. */
    remote = *ss;
    remotelen = sslen;
    if (remote.ss_family == AF_INET)
        ((struct sockaddr_in*) &remote)->sin_port = htons (port);
    else if (remote.ss_family == AF_INET6)
        ((struct sockaddr_in6*) &remote)->sin6_port = htons (port);
    else
        nn_assert (0);

    /*  Try to start the underlying socket. */
    rc = nn_usock_start (&self->usock, remote.ss_family, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_CTCP_STATE_WAITING;
        return;
    }

    /*  Set the relevant socket options. */
    sz = sizeof (val);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_SNDBUF, &val, &sz);
    nn_assert (sz == sizeof (val));
    nn_usock_setsockopt (&self->usock, SOL_SOCKET, SO_SNDBUF,
        &val, sizeof (val));
    sz = sizeof (val);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_RCVBUF, &val, &sz);
    nn_assert (sz == sizeof (val));
    nn_usock_setsockopt (&self->usock, SOL_SOCKET, SO_RCVBUF,
        &val, sizeof (val));
    sz = sizeof (val);
    nn_ep_getopt (self->ep, NN_TCP, NN_TCP_NODELAY, &val, &sz);
    nn_assert (sz == sizeof (val));
    nn_usock_setsockopt (&self->usock, IPPROTO_TCP, TCP_NODELAY,
        &val, sizeof (val));

    /*  Bind the socket to the local network interface. */
    rc = nn_usock_bind (&self->usock, (struct sockaddr*) &local, locallen);
    if (nn_slow (rc != 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_CTCP_STATE_WAITING;
        return;
    }

    /*  Start connecting. */
    nn_usock_connect (&self->usock, (struct sockaddr*) &remote, remotelen);
    self->state = NN_CTCP_STATE_CONNECTING;
    nn_ep_stat_increment (self->ep, NN_STAT_INPROGRESS_CONNECTIONS, 1);
}